

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall
Lowerer::EmitRestoreReturnValueFromEHBailout
          (Lowerer *this,LabelInstr *restoreLabel,LabelInstr *epilogLabel)

{
  code *pcVar1;
  bool bVar2;
  RegNum reg;
  OpCode opcode;
  undefined4 *puVar3;
  SymOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  BranchInstr *instr_00;
  
  if ((this->m_func->field_0x243 & 1) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6e32,"(this->m_func->isPostLayout)","this->m_func->isPostLayout");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  src1Opnd = IR::SymOpnd::New(&this->m_func->m_bailoutReturnValueSym->super_Sym,TyVar,this->m_func);
  reg = LowererMDArch::GetRegReturn(TyInt64);
  dstOpnd = IR::RegOpnd::New((StackSym *)0x0,reg,TyInt64,this->m_func);
  opcode = LowererMDArch::GetAssignOp(TyVar);
  instr = IR::Instr::New(opcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(&epilogLabel->super_Instr,&restoreLabel->super_Instr);
  IR::Instr::InsertBefore(&epilogLabel->super_Instr,instr);
  LowererMD::Legalize<false>(instr,false);
  instr_00 = IR::BranchInstr::New(JMP,epilogLabel,this->m_func);
  IR::Instr::InsertBefore(&restoreLabel->super_Instr,&instr_00->super_Instr);
  return;
}

Assistant:

void
Lowerer::EmitRestoreReturnValueFromEHBailout(IR::LabelInstr * restoreLabel, IR::LabelInstr * epilogLabel)
{
    Assert(this->m_func->isPostLayout);
    //          JMP $epilog
    // $restore:
    //          MOV eax, bailoutReturnValueSym
    // $epilog:

    IR::SymOpnd * bailoutReturnValueSymOpnd = IR::SymOpnd::New(this->m_func->GetBailoutReturnValueSym(), TyVar, this->m_func);
    IR::RegOpnd * eaxOpnd = IR::RegOpnd::New(NULL, LowererMD::GetRegReturn(TyMachReg), TyMachReg, this->m_func);

    IR::Instr * movInstr = IR::Instr::New(LowererMD::GetLoadOp(TyVar), eaxOpnd, bailoutReturnValueSymOpnd, this->m_func);

    epilogLabel->InsertBefore(restoreLabel);
    epilogLabel->InsertBefore(movInstr);
    LowererMD::Legalize(movInstr);
    restoreLabel->InsertBefore(IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, epilogLabel, this->m_func));
}